

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O0

void __thiscall Assimp::FileSystemFilter::~FileSystemFilter(FileSystemFilter *this)

{
  void *in_RSI;
  FileSystemFilter *this_local;
  
  ~FileSystemFilter(this);
  Intern::AllocateFromAssimpHeap::operator_delete((AllocateFromAssimpHeap *)this,in_RSI);
  return;
}

Assistant:

~FileSystemFilter() {
        // empty
    }